

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O1

int __thiscall xmrig::OclBackendPrivate::init(OclBackendPrivate *this,EVP_PKEY_CTX *ctx)

{
  size_t sVar1;
  pointer pOVar2;
  ulong uVar3;
  pointer pOVar4;
  uint uVar5;
  PciTopology *extraout_RAX;
  PciTopology *extraout_RAX_00;
  PciTopology *extraout_RAX_01;
  ulong uVar7;
  PciTopology *extraout_RAX_02;
  char *pcVar8;
  ulong uVar9;
  PciTopology *pPVar10;
  pointer pOVar11;
  OclPlatform OVar12;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> local_68;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> local_48;
  PciTopology *pPVar6;
  
  if (ctx[1] == (EVP_PKEY_CTX)0x1) {
    uVar5 = OclLib::init(*(EVP_PKEY_CTX **)(ctx + 0x20));
    pPVar6 = (PciTopology *)(ulong)uVar5;
    if ((char)uVar5 == '\0') {
      pcVar8 = "\x1b[0;31m (failed to load OpenCL runtime)";
    }
    else {
      if ((this->platform).m_id != (cl_platform_id)0x0) goto LAB_001627e1;
      OVar12 = OclConfig::platform((OclConfig *)ctx);
      this->platform = OVar12;
      if (OVar12.m_id == (cl_platform_id)0x0) {
        pcVar8 = "\x1b[0;31m (selected OpenCL platform NOT found)";
      }
      else {
        OclPlatform::devices(&local_68,&this->platform);
        local_48.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
        super__Vector_impl_data._M_start =
             (this->devices).super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_48.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (this->devices).super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_48.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (this->devices).super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->devices).super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_68.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (this->devices).super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this->devices).super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_68.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_68.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::~vector(&local_48);
        std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::~vector(&local_68);
        if ((this->devices).super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (this->devices).super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          sVar1 = (this->platform).m_index;
          OclPlatform::name((OclPlatform *)&local_48);
          pOVar11 = local_48.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          OclPlatform::version((OclPlatform *)&local_68);
          Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;36m#%zu \x1b[0m\x1b[1;37m%s\x1b[0m/\x1b[1;37m%s\x1b[0m"
                     ,"OPENCL",sVar1,pOVar11,
                     local_68.
                     super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl
                     .super__Vector_impl_data._M_start);
          pPVar6 = extraout_RAX;
          if (local_68.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete__(local_68.
                              super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            pPVar6 = extraout_RAX_00;
          }
          if (local_48.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete__(local_48.
                              super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            pPVar6 = extraout_RAX_01;
          }
          pOVar11 = (this->devices).
                    super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pOVar2 = (this->devices).
                   super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pOVar11 != pOVar2) {
            pPVar10 = &pOVar11->m_topology;
            do {
              uVar5 = *(uint *)(pPVar10 + -2);
              PciTopology::toString((PciTopology *)&local_48);
              pOVar4 = local_48.
                       super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              OclDevice::printableName((OclDevice *)&local_68);
              pOVar11 = local_68.
                        super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              uVar7 = OclDevice::clock((OclDevice *)(pPVar10 + -0x17));
              uVar3 = *(ulong *)(pPVar10 + -5);
              uVar9 = *(ulong *)(pPVar10 + -7);
              if (uVar3 < *(ulong *)(pPVar10 + -7)) {
                uVar9 = uVar3;
              }
              Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;36m#%zu\x1b[0m\x1b[0;33m %s\x1b[0m %s \x1b[1;37m%u MHz\x1b[0m cu:\x1b[1;37m%u\x1b[0m mem:\x1b[0;36m%zu/%zu\x1b[0m MB"
                         ,"OPENCL GPU",(ulong)uVar5,pOVar4,pOVar11,uVar7 & 0xffffffff,
                         (ulong)*(uint *)(pPVar10 + -3),uVar9 >> 0x14,uVar3 >> 0x14);
              if (local_68.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete__(local_68.
                                  super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_48.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete__(local_48.
                                  super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
              }
              pPVar6 = pPVar10 + 0x1a;
              pOVar11 = (pointer)(pPVar10 + 3);
              pPVar10 = pPVar6;
            } while (pOVar11 != pOVar2);
          }
          goto LAB_001627e1;
        }
        pcVar8 = "\x1b[0;31m (no devices)";
      }
    }
  }
  else {
    pcVar8 = "";
  }
  Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;31mdisabled\x1b[0m%s","OPENCL",pcVar8
            );
  pPVar6 = extraout_RAX_02;
LAB_001627e1:
  return (int)pPVar6;
}

Assistant:

void init(const OclConfig &cl)
    {
        if (!cl.isEnabled()) {
            return printDisabled("");
        }

        if (!OclLib::init(cl.loader())) {
            return printDisabled(RED_S " (failed to load OpenCL runtime)");
        }

        if (platform.isValid()) {
            return;
        }

        platform = cl.platform();
        if (!platform.isValid()) {
            return printDisabled(RED_S " (selected OpenCL platform NOT found)");
        }

        devices = platform.devices();
        if (devices.empty()) {
            return printDisabled(RED_S " (no devices)");
        }

        Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") CYAN_BOLD("#%zu ") WHITE_BOLD("%s") "/" WHITE_BOLD("%s"), "OPENCL", platform.index(), platform.name().data(), platform.version().data());

        for (const OclDevice &device : devices) {
            Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") CYAN_BOLD("#%zu") YELLOW(" %s") " %s " WHITE_BOLD("%u MHz") " cu:" WHITE_BOLD("%u") " mem:" CYAN("%zu/%zu") " MB",
                       "OPENCL GPU",
                       device.index(),
                       device.topology().toString().data(),
                       device.printableName().data(),
                       device.clock(),
                       device.computeUnits(),
                       device.freeMemSize() / oneMiB,
                       device.globalMemSize() / oneMiB);
        }
    }